

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.cc
# Opt level: O0

char * __thiscall
google::protobuf::internal::EpsCopyInputStream::ReadArenaString
          (EpsCopyInputStream *this,char *ptr,ArenaStringPtr *s,Arena *arena)

{
  uint32_t size_00;
  LogMessage *pLVar1;
  string *s_00;
  string *str;
  int size;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  LogMessageFatal local_48 [22];
  Voidify local_32;
  ScopedCheckPtrInvariants local_31;
  Arena *pAStack_30;
  ScopedCheckPtrInvariants check;
  Arena *arena_local;
  ArenaStringPtr *s_local;
  char *ptr_local;
  EpsCopyInputStream *this_local;
  
  pAStack_30 = arena;
  s_local = (ArenaStringPtr *)ptr;
  ptr_local = (char *)this;
  anon_unknown_7::ScopedCheckPtrInvariants::ScopedCheckPtrInvariants(&local_31,&s->tagged_ptr_);
  if (pAStack_30 == (Arena *)0x0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_58,"arena != nullptr");
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_48,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/arenastring.cc"
               ,0x10e,local_58._M_len,local_58._M_str);
    pLVar1 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_48);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_32,pLVar1);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_48);
  }
  size_00 = ReadSize((char **)&s_local);
  if (s_local == (ArenaStringPtr *)0x0) {
    this_local = (EpsCopyInputStream *)0x0;
  }
  else {
    s_00 = ArenaStringPtr::NewString<>(s,pAStack_30);
    this_local = (EpsCopyInputStream *)ReadString(this,(char *)s_local,size_00,s_00);
    if (this_local == (EpsCopyInputStream *)0x0) {
      this_local = (EpsCopyInputStream *)0x0;
    }
  }
  return (char *)this_local;
}

Assistant:

const char* EpsCopyInputStream::ReadArenaString(const char* ptr,
                                                ArenaStringPtr* s,
                                                Arena* arena) {
  ScopedCheckPtrInvariants check(&s->tagged_ptr_);
  ABSL_DCHECK(arena != nullptr);

  int size = ReadSize(&ptr);
  if (!ptr) return nullptr;

  auto* str = s->NewString(arena);
  ptr = ReadString(ptr, size, str);
  GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
  return ptr;
}